

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeZ.cpp
# Opt level: O2

void __thiscall OpenMD::ChargeZ::process(ChargeZ *this)

{
  char cVar1;
  SimInfo *info;
  Snapshot *pSVar2;
  pointer pvVar3;
  long lVar4;
  pointer pdVar5;
  AtomType *pAVar6;
  SelectionManager *this_00;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  double dVar12;
  RealType RVar13;
  double dVar14;
  int ii;
  RealType area;
  StuntDouble *sd;
  FluctuatingChargeAdapter fqa;
  Vector3d pos;
  Mat3x3d hmat;
  DumpReader reader;
  int local_134c;
  double local_1348;
  value_type_conflict2 local_1340;
  StuntDouble *local_1338;
  int local_132c;
  double local_1328;
  SelectionEvaluator *local_1320;
  SelectionManager *local_1318;
  vector<double,_std::allocator<double>_> *local_1310;
  vector<double,_std::allocator<double>_> *local_1308;
  ulong local_1300;
  ulong local_12f8;
  FluctuatingChargeAdapter local_12f0;
  SelectionSet local_12e8;
  Mat3x3d local_12d0;
  DumpReader local_1288;
  
  info = (this->super_StaticAnalyser).info_;
  cVar1 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&local_1288,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_132c = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = local_132c / (this->super_StaticAnalyser).step_;
  local_1308 = &this->zBox_;
  local_1310 = &this->areas_;
  local_1320 = &this->evaluator_;
  local_1318 = &this->seleMan_;
  uVar9 = 0;
  while (this_00 = local_1318, (int)uVar9 < local_132c) {
    local_1300 = uVar9;
    DumpReader::readFrame(&local_1288,(int)uVar9);
    pSVar2 = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    this->currentSnapshot_ = pSVar2;
    uVar11 = (this->super_StaticAnalyser).nBins_;
    pvVar3 = (this->sliceSDLists_).
             super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar10 = 0; (ulong)uVar11 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar10);
      if (*(long *)((long)&(pvVar3->
                           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish + lVar10) != lVar4) {
        *(long *)((long)&(pvVar3->
                         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish + lVar10) = lVar4;
      }
    }
    Snapshot::getHmat(&local_12d0,pSVar2);
    std::vector<double,_std::allocator<double>_>::push_back
              (local_1308,
               (value_type_conflict2 *)
               ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)(uint)this->axis_ * 0x20));
    uVar11 = this->axis_;
    local_1340 = 0.0;
    local_1348 = *(double *)
                  ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                         data_ + (ulong)uVar11 * 0x20) * 0.5;
    pSVar2 = this->currentSnapshot_;
    if ((ulong)uVar11 == 0) {
      local_1340 = Snapshot::getYZarea(pSVar2);
    }
    else if (uVar11 == 1) {
      local_1340 = Snapshot::getXZarea(pSVar2);
    }
    else {
      local_1340 = Snapshot::getXYarea(pSVar2);
    }
    std::vector<double,_std::allocator<double>_>::push_back(local_1310,&local_1340);
    if ((this->evaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_12e8,local_1320);
      SelectionManager::setSelectionSet(this_00,&local_12e8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12e8.bitsets_);
    }
    local_1338 = SelectionManager::beginSelected(this_00,&local_134c);
    while (local_1338 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,local_1338);
      if (cVar1 != '\0') {
        Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&local_12e8);
      }
      StuntDouble::setPos(local_1338,(Vector3d *)&local_12e8);
      local_1338 = SelectionManager::nextSelected(this_00,&local_134c);
    }
    local_1338 = SelectionManager::beginSelected(this_00,&local_134c);
    while (local_1338 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_12e8,local_1338);
      iVar8 = (int)((((double)(&local_12e8.bitsets_.
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start)[(uint)this->axis_] +
                     local_1348) * (double)(this->super_StaticAnalyser).nBins_) /
                   *(double *)
                    ((long)local_12d0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)(uint)this->axis_ * 0x20));
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::push_back
                ((this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + iVar8,&local_1338);
      pdVar5 = (this->sliceSDCount_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5[iVar8] = pdVar5[iVar8] + 1.0;
      local_1338 = SelectionManager::nextSelected(this_00,&local_134c);
    }
    local_1338 = (value_type)0x0;
    uVar9 = 0;
    while (uVar9 < (this->super_StaticAnalyser).nBins_) {
      uVar11 = 0;
      dVar12 = 0.0;
      local_12f8 = uVar9;
      while( true ) {
        pvVar3 = (this->sliceSDLists_).
                 super__Vector_base<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = *(long *)&pvVar3[uVar9].
                           super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                           ._M_impl.super__Vector_impl_data;
        if ((ulong)((long)pvVar3[uVar9].
                          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) <= (ulong)uVar11
           ) break;
        lVar10 = *(long *)(lVar10 + (ulong)uVar11 * 8);
        dVar14 = 0.0;
        if (*(uint *)(lVar10 + 8) < 2) {
          pAVar6 = *(AtomType **)(lVar10 + 0x78);
          local_1348 = dVar12;
          local_12e8.bitsets_.
          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pAVar6;
          bVar7 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)&local_12e8);
          dVar12 = 0.0;
          if (bVar7) {
            RVar13 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)&local_12e8);
            dVar12 = RVar13 + 0.0;
          }
          local_1328 = dVar12;
          local_12f0.at_ = pAVar6;
          bVar7 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_12f0);
          dVar12 = local_1348;
          dVar14 = local_1328;
          if (bVar7) {
            dVar14 = local_1328 +
                     *(double *)
                      (*(long *)(*(long *)(*(long *)(lVar10 + 0x18) + 0x18) + 0x150 +
                                *(long *)(lVar10 + 0x10)) + (long)*(int *)(lVar10 + 0x30) * 8);
          }
        }
        dVar12 = dVar12 + dVar14;
        uVar11 = uVar11 + 1;
      }
      pdVar5 = (this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5[local_12f8] = dVar12 + pdVar5[local_12f8];
      uVar9 = local_12f8 + 1;
    }
    uVar9 = (ulong)(uint)((int)local_1300 + (this->super_StaticAnalyser).step_);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void ChargeZ::process() {
    StuntDouble* sd;
    int ii;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      for (unsigned int i = 0; i < nBins_; i++) {
        sliceSDLists_[i].clear();
      }

      Mat3x3d hmat = currentSnapshot_->getHmat();
      zBox_.push_back(hmat(axis_, axis_));

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;
      RealType area      = 0.0;
      switch (axis_) {
      case 0:
        area = currentSnapshot_->getYZarea();
        break;
      case 1:
        area = currentSnapshot_->getXZarea();
        break;
      case 2:
      default:
        area = currentSnapshot_->getXYarea();
        break;
      }

      areas_.push_back(area);

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // wrap the stuntdoubles into a cell
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(pos);
        sd->setPos(pos);
      }

      // determine which atom belongs to which slice
      for (sd = seleMan_.beginSelected(ii); sd != NULL;
           sd = seleMan_.nextSelected(ii)) {
        Vector3d pos = sd->getPos();
        // shift molecules by half a box to have bins start at 0
        int binNo = int(nBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
        sliceSDLists_[binNo].push_back(sd);
        sliceSDCount_[binNo]++;
      }

      // loop over the slices to calculate the charge
      for (unsigned int i = 0; i < nBins_; i++) {
        RealType binC = 0;
        for (unsigned int k = 0; k < sliceSDLists_[i].size(); ++k) {
          RealType q = 0.0;
          Atom* atom = static_cast<Atom*>(sliceSDLists_[i][k]);

          AtomType* atomType = atom->getAtomType();

          if (sliceSDLists_[i][k]->isAtom()) {
            FixedChargeAdapter fca = FixedChargeAdapter(atomType);
            if (fca.isFixedCharge()) { q += fca.getCharge(); }

            FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
            if (fqa.isFluctuatingCharge()) { q += atom->getFlucQPos(); }
          }

          binC += q;
        }
        chargeZ_[i] += binC;
        // Units of (e / Ang^2 / fs)
      }
    }

    writeChargeZ();
  }